

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_y_convolve_4tap_32x2_avx2(void)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  __m256i *in_stack_fffffffffffffe80;
  __m256i *in_stack_fffffffffffffe88;
  
  puVar1 = (undefined8 *)(in_RDI + in_RSI * 6);
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  *(undefined8 *)(in_RDX + 0x60) = *puVar1;
  *(undefined8 *)(in_RDX + 0x68) = uVar3;
  *(undefined8 *)(in_RDX + 0x70) = uVar4;
  *(undefined8 *)(in_RDX + 0x78) = uVar5;
  auVar2 = vpunpcklwd_avx2(*(undefined1 (*) [32])(in_RDX + 0x40),
                           *(undefined1 (*) [32])(in_RDX + 0x60));
  *(undefined1 (*) [32])(in_RCX + 4) = auVar2;
  auVar2 = vpunpckhwd_avx2(*(undefined1 (*) [32])(in_RDX + 0x40),
                           *(undefined1 (*) [32])(in_RDX + 0x60));
  *(undefined1 (*) [32])(in_RCX + 0xc) = auVar2;
  puVar1 = (undefined8 *)(in_RDI + in_RSI * 8);
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  *(undefined8 *)(in_RDX + 0x40) = *puVar1;
  *(undefined8 *)(in_RDX + 0x48) = uVar3;
  *(undefined8 *)(in_RDX + 0x50) = uVar4;
  *(undefined8 *)(in_RDX + 0x58) = uVar5;
  auVar2 = vpunpcklwd_avx2(*(undefined1 (*) [32])(in_RDX + 0x60),
                           *(undefined1 (*) [32])(in_RDX + 0x40));
  *(undefined1 (*) [32])(in_R8 + 4) = auVar2;
  auVar2 = vpunpckhwd_avx2(*(undefined1 (*) [32])(in_RDX + 0x60),
                           *(undefined1 (*) [32])(in_RDX + 0x40));
  *(undefined1 (*) [32])(in_R8 + 0xc) = auVar2;
  xy_y_convolve_4tap_16_avx2
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,(__m256i *)0x9a6ddb);
  xy_y_convolve_4tap_16_avx2
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,(__m256i *)0x9a6df2);
  *in_RCX = in_RCX[4];
  in_RCX[1] = in_RCX[5];
  in_RCX[2] = in_RCX[6];
  in_RCX[3] = in_RCX[7];
  in_RCX[8] = in_RCX[0xc];
  in_RCX[9] = in_RCX[0xd];
  in_RCX[10] = in_RCX[0xe];
  in_RCX[0xb] = in_RCX[0xf];
  *in_R8 = in_R8[4];
  in_R8[1] = in_R8[5];
  in_R8[2] = in_R8[6];
  in_R8[3] = in_R8[7];
  in_R8[8] = in_R8[0xc];
  in_R8[9] = in_R8[0xd];
  in_R8[10] = in_R8[0xe];
  in_R8[0xb] = in_R8[0xf];
  return;
}

Assistant:

static inline void xy_y_convolve_4tap_32x2_avx2(
    const int16_t *const src, const ptrdiff_t stride, __m256i s_256[4],
    __m256i ss_256[4], __m256i tt_256[4], const __m256i coeffs[2],
    __m256i r[4]) {
  s_256[3] = _mm256_loadu_si256((__m256i *)(src + 3 * stride));
  ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
  ss_256[3] = _mm256_unpackhi_epi16(s_256[2], s_256[3]);
  s_256[2] = _mm256_loadu_si256((__m256i *)(src + 4 * stride));
  tt_256[1] = _mm256_unpacklo_epi16(s_256[3], s_256[2]);
  tt_256[3] = _mm256_unpackhi_epi16(s_256[3], s_256[2]);
  xy_y_convolve_4tap_16_avx2(ss_256, coeffs, r + 0);
  xy_y_convolve_4tap_16_avx2(tt_256, coeffs, r + 2);
  ss_256[0] = ss_256[1];
  ss_256[2] = ss_256[3];
  tt_256[0] = tt_256[1];
  tt_256[2] = tt_256[3];
}